

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O1

int __thiscall
btGeneric6DofConstraint::setLinearLimits
          (btGeneric6DofConstraint *this,btConstraintInfo2 *info,int row,btTransform *transA,
          btTransform *transB,btVector3 *linVelA,btVector3 *linVelB,btVector3 *angVelA,
          btVector3 *angVelB)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  btScalar *pbVar6;
  byte bVar7;
  long lVar8;
  btScalar *pbVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  btRotationalLimitMotor local_b8;
  btRotationalLimitMotor *local_70;
  btScalar *local_68;
  btTransform *local_60;
  btTransform *local_58;
  btVector3 *local_50;
  ulong local_48;
  btVector3 axis;
  
  local_b8.m_currentLimit = 0;
  local_b8.m_accumulatedImpulse = 0.0;
  local_68 = &info->erp;
  local_70 = this->m_angularLimits;
  lVar12 = 0x434;
  local_48 = 2;
  lVar11 = 0x32c;
  lVar10 = 0;
  bVar7 = 0;
  local_60 = transA;
  local_58 = transB;
  local_50 = linVelA;
  do {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_48;
    if ((*(int *)((long)(this->m_linearLimits).m_currentLimit + lVar10) != 0) ||
       (*(char *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar11 + -0x48) != '\0')) {
      local_b8.m_bounce = 0.0;
      local_b8.m_currentLimit = *(int *)((long)(this->m_linearLimits).m_currentLimit + lVar10);
      local_b8.m_currentPosition =
           *(btScalar *)((long)(this->m_linearLimits).m_currentLinearDiff.m_floats + lVar10);
      local_b8.m_currentLimitError =
           *(btScalar *)((long)(this->m_linearLimits).m_currentLimitError.m_floats + lVar10);
      local_b8.m_enableMotor =
           *(bool *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar11 + -0x48);
      uVar1 = (this->m_linearLimits).m_limitSoftness;
      uVar2 = (this->m_linearLimits).m_damping;
      local_b8.m_hiLimit =
           *(btScalar *)((long)(this->m_linearLimits).m_upperLimit.m_floats + lVar10);
      local_b8.m_loLimit =
           *(btScalar *)((long)(this->m_linearLimits).m_lowerLimit.m_floats + lVar10);
      local_b8.m_maxLimitForce = 0.0;
      local_b8.m_maxMotorForce =
           *(btScalar *)((long)(this->m_linearLimits).m_maxMotorForce.m_floats + lVar10);
      local_b8.m_targetVelocity =
           *(btScalar *)((long)(this->m_linearLimits).m_targetVelocity.m_floats + lVar10);
      axis.m_floats[1] =
           (btScalar)
           *(undefined4 *)((long)(this->m_calculatedTransformA).m_basis.m_el[1].m_floats + lVar10);
      axis.m_floats[0] =
           (btScalar)
           *(undefined4 *)((long)(this->m_calculatedTransformA).m_basis.m_el[0].m_floats + lVar10);
      axis.m_floats[2] =
           (btScalar)
           *(undefined4 *)((long)(this->m_calculatedTransformA).m_basis.m_el[2].m_floats + lVar10);
      axis.m_floats[3] = 0.0;
      uVar4 = this->m_flags >> (bVar7 & 0x1f);
      if ((uVar4 & 1) == 0) {
        pbVar9 = info->cfm;
      }
      else {
        pbVar9 = (btScalar *)((long)(this->m_linearLimits).m_normalCFM.m_floats + lVar10);
      }
      local_b8.m_normalCFM = *pbVar9;
      if ((uVar4 & 2) == 0) {
        pbVar9 = info->cfm;
      }
      else {
        pbVar9 = (btScalar *)((long)(this->m_linearLimits).m_stopCFM.m_floats + lVar10);
      }
      pbVar6 = (btScalar *)((long)(this->m_linearLimits).m_stopERP.m_floats + lVar10);
      if ((uVar4 & 4) == 0) {
        pbVar6 = local_68;
      }
      local_b8.m_stopCFM = *pbVar9;
      local_b8.m_stopERP = *pbVar6;
      uVar4 = 0;
      if (this->m_useOffsetForConstraintFrame == true) {
        lVar8 = 0;
        if (lVar10 != 8) {
          lVar8 = lVar11 + -0x32b;
        }
        if (local_70[lVar8].m_currentLimit == 0) {
          uVar4 = 1;
        }
        else {
          uVar4 = (uint)(*(int *)((long)this +
                                 lVar12 + (SUB168(auVar3 * ZEXT816(0xaaaaaaaaaaaaaaab),8) &
                                          0x7fffffffffffffe) * -0x60) == 0);
        }
      }
      local_b8.m_damping = (btScalar)uVar2;
      local_b8.m_limitSoftness = (btScalar)uVar1;
      iVar5 = get_limit_motor_info2
                        (this,&local_b8,local_60,local_58,local_50,linVelB,angVelA,angVelB,info,row,
                         &axis,0,uVar4);
      row = iVar5 + row;
    }
    lVar12 = lVar12 + 0x40;
    local_48 = local_48 + 1;
    bVar7 = bVar7 + 3;
    lVar11 = lVar11 + 1;
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0xc);
  return row;
}

Assistant:

int btGeneric6DofConstraint::setLinearLimits(btConstraintInfo2* info, int row, const btTransform& transA,const btTransform& transB,const btVector3& linVelA,const btVector3& linVelB,const btVector3& angVelA,const btVector3& angVelB)
{
//	int row = 0;
	//solve linear limits
	btRotationalLimitMotor limot;
	for (int i=0;i<3 ;i++ )
	{
		if(m_linearLimits.needApplyForce(i))
		{ // re-use rotational motor code
			limot.m_bounce = btScalar(0.f);
			limot.m_currentLimit = m_linearLimits.m_currentLimit[i];
			limot.m_currentPosition = m_linearLimits.m_currentLinearDiff[i];
			limot.m_currentLimitError  = m_linearLimits.m_currentLimitError[i];
			limot.m_damping  = m_linearLimits.m_damping;
			limot.m_enableMotor  = m_linearLimits.m_enableMotor[i];
			limot.m_hiLimit  = m_linearLimits.m_upperLimit[i];
			limot.m_limitSoftness  = m_linearLimits.m_limitSoftness;
			limot.m_loLimit  = m_linearLimits.m_lowerLimit[i];
			limot.m_maxLimitForce  = btScalar(0.f);
			limot.m_maxMotorForce  = m_linearLimits.m_maxMotorForce[i];
			limot.m_targetVelocity  = m_linearLimits.m_targetVelocity[i];
			btVector3 axis = m_calculatedTransformA.getBasis().getColumn(i);
			int flags = m_flags >> (i * BT_6DOF_FLAGS_AXIS_SHIFT);
			limot.m_normalCFM	= (flags & BT_6DOF_FLAGS_CFM_NORM) ? m_linearLimits.m_normalCFM[i] : info->cfm[0];
			limot.m_stopCFM		= (flags & BT_6DOF_FLAGS_CFM_STOP) ? m_linearLimits.m_stopCFM[i] : info->cfm[0];
			limot.m_stopERP		= (flags & BT_6DOF_FLAGS_ERP_STOP) ? m_linearLimits.m_stopERP[i] : info->erp;
			if(m_useOffsetForConstraintFrame)
			{
				int indx1 = (i + 1) % 3;
				int indx2 = (i + 2) % 3;
				int rotAllowed = 1; // rotations around orthos to current axis
				if(m_angularLimits[indx1].m_currentLimit && m_angularLimits[indx2].m_currentLimit)
				{
					rotAllowed = 0;
				}
				row += get_limit_motor_info2(&limot, transA,transB,linVelA,linVelB,angVelA,angVelB, info, row, axis, 0, rotAllowed);
			}
			else
			{
				row += get_limit_motor_info2(&limot, transA,transB,linVelA,linVelB,angVelA,angVelB, info, row, axis, 0);
			}
		}
	}
	return row;
}